

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

bool jbcoin::STObject::equivalentSTObject(STObject *obj1,STObject *obj2)

{
  int iVar1;
  int iVar2;
  STBase *pSVar3;
  pointer ppSVar4;
  STBase *pSVar5;
  pointer ppSVar6;
  bool bVar7;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> sf2;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> sf1;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> local_60;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> local_48;
  
  getSortedFields(&local_48,obj1);
  getSortedFields(&local_60,obj2);
  ppSVar6 = local_48.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar4 = local_60.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)local_48.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_48.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_60.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_60.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    bVar7 = local_48.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_48.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    if (bVar7) goto LAB_001b5bab;
    pSVar3 = *local_48.
              super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar5 = *local_60.
              super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar1 = (*pSVar3->_vptr_STBase[4])(pSVar3);
    iVar2 = (*pSVar5->_vptr_STBase[4])(pSVar5);
    if (iVar1 == iVar2) {
      do {
        ppSVar6 = ppSVar6 + 1;
        ppSVar4 = ppSVar4 + 1;
        iVar1 = (*pSVar3->_vptr_STBase[9])(pSVar3,pSVar5);
        if ((char)iVar1 == '\0') break;
        bVar7 = ppSVar6 ==
                local_48.
                super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        if (bVar7) goto LAB_001b5bab;
        pSVar3 = *ppSVar6;
        pSVar5 = *ppSVar4;
        iVar1 = (*pSVar3->_vptr_STBase[4])(pSVar3);
        iVar2 = (*pSVar5->_vptr_STBase[4])(pSVar5);
      } while (iVar1 == iVar2);
    }
  }
  bVar7 = false;
LAB_001b5bab:
  if (local_60.super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool STObject::equivalentSTObject (STObject const& obj1, STObject const& obj2)
{
    auto sf1 = getSortedFields (obj1);
    auto sf2 = getSortedFields (obj2);

    return std::equal (sf1.begin (), sf1.end (), sf2.begin (), sf2.end (),
        [] (STBase const* st1, STBase const* st2)
        {
            return (st1->getSType() == st2->getSType()) &&
                st1->isEquivalent (*st2);
        });
}